

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randunified.cpp
# Opt level: O3

void __thiscall NaRandUnifiedFunc::ddescr_addh(NaRandUnifiedFunc *this,DimDescr *dd)

{
  uint uVar1;
  DimDescr *__src;
  ulong uVar2;
  NaReal NVar3;
  NaReal NVar4;
  NaReal NVar5;
  DimDescr *__s;
  uint uVar6;
  
  uVar1 = this->n_ddescr;
  this->n_ddescr = uVar1 + 1;
  uVar2 = (ulong)(uVar1 + 1) * 0x28;
  __s = (DimDescr *)operator_new__(uVar2);
  uVar6 = 0xffffffff;
  if (uVar1 != 0xffffffff) {
    memset(__s,0,((uVar2 - 0x28) / 0x28) * 0x28 + 0x28);
    uVar6 = 0;
    if (uVar1 != 0) {
      __src = this->ddescr;
      memcpy(__s,__src,(ulong)uVar1 * 0x28);
      uVar6 = uVar1;
      if (__src != (DimDescr *)0x0) {
        operator_delete__(__src);
        uVar6 = this->n_ddescr - 1;
      }
    }
  }
  this->ddescr = __s;
  __s[uVar6].Aprev = dd->Aprev;
  NVar3 = dd->Amin;
  NVar4 = dd->Amax;
  NVar5 = dd->Afirst;
  __s[uVar6].Amaxstep = dd->Amaxstep;
  (&__s[uVar6].Amaxstep)[1] = NVar5;
  __s[uVar6].Amin = NVar3;
  __s[uVar6].Amax = NVar4;
  return;
}

Assistant:

void
NaRandUnifiedFunc::ddescr_addh (const DimDescr& dd)
{
	DimDescr	*pNew = new DimDescr[++n_ddescr];
	if(n_ddescr > 1) {
		memcpy(pNew, ddescr, sizeof(DimDescr) * (n_ddescr - 1));
		delete[] ddescr;
	}
	ddescr = pNew;
	ddescr[n_ddescr - 1] = dd;
}